

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<double>::Decompose_LDLt(TPZMatrix<double> *this)

{
  int iVar1;
  bool bVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double a;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double val;
  int k_1;
  double sum_1;
  int l;
  double tmp;
  int k;
  double sum;
  int j;
  int dim;
  char *in_stack_00000168;
  char *in_stack_00000170;
  double local_58;
  int local_4c;
  double local_48;
  int local_3c;
  double local_38;
  double local_30;
  int local_24;
  double local_20;
  int local_18;
  int local_14;
  
  if ((in_RDI->fDecomposed == '\0') || (in_RDI->fDecomposed == '\x04')) {
    if (in_RDI->fDecomposed != '\0') {
      return 4;
    }
  }
  else {
    Error(in_stack_00000170,in_stack_00000168);
  }
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar3 != iVar4) {
    Error(in_stack_00000170,in_stack_00000168);
  }
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  local_14 = (int)iVar3;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_20 = 0.0;
    for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_24,(long)local_24);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_24,(long)local_18);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_24,(long)local_18);
      local_20 = extraout_XMM0_Qa * extraout_XMM0_Qa_00 * extraout_XMM0_Qa_01 + local_20;
    }
    lVar5 = (long)local_18;
    lVar6 = (long)local_18;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_18);
    local_30 = extraout_XMM0_Qa_02 - local_20;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar5,lVar6,&local_30);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_18);
    local_38 = a;
    bVar2 = IsZero(a);
    iVar1 = local_18;
    if (bVar2) {
      Error(in_stack_00000170,in_stack_00000168);
      iVar1 = local_18;
    }
    while (local_3c = iVar1 + 1, local_3c < local_14) {
      local_48 = 0.0;
      for (local_4c = 0; local_4c < local_18; local_4c = local_4c + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_4c,(long)local_4c);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_4c);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_3c,(long)local_4c);
        local_48 = extraout_XMM0_Qa_03 * extraout_XMM0_Qa_04 * extraout_XMM0_Qa_05 + local_48;
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_3c,(long)local_18);
      local_58 = (extraout_XMM0_Qa_06 - local_48) / local_38;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_3c,(long)local_18,&local_58);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_18,(long)local_3c,&local_58);
      iVar1 = local_3c;
    }
  }
  in_RDI->fDecomposed = '\x04';
  in_RDI->fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}